

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

uint64_t compute_cdef_dist_highbd
                   (void *dst,int dstride,uint16_t *src,cdef_list *dlist,int cdef_count,
                   BLOCK_SIZE bsize,int coeff_shift,int row,int col)

{
  uint64_t uVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  int height_log2;
  int width_log2;
  int height;
  int width;
  int src_stride;
  uint16_t *dst_buff;
  uint16_t *dst16;
  int by;
  int bx;
  int bi;
  uint64_t sum;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  ulong local_30;
  int local_24;
  long local_20;
  long local_18;
  int local_c;
  
  local_30 = 0;
  local_48 = in_RDI * 2;
  local_50 = local_48 + (long)(width * in_ESI + (int)dst_buff) * 2;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  init_src_params(&local_54,&local_58,&local_5c,&local_60,&local_64,in_R9B);
  for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
    local_3c = (uint)*(byte *)(local_20 + (long)local_34 * 2);
    local_38 = (uint)*(byte *)(local_20 + 1 + (long)local_34 * 2);
    uVar1 = (*aom_mse_wxh_16bit_highbd)
                      ((uint16_t *)
                       (local_50 +
                       (long)(int)((local_3c << ((byte)local_64 & 0x1f)) * local_c +
                                  (local_38 << ((byte)local_60 & 0x1f))) * 2),local_c,
                       (uint16_t *)
                       (local_18 + (long)(local_34 << ((byte)local_64 + (byte)local_60 & 0x1f)) * 2)
                       ,local_54,local_58,local_5c);
    local_30 = uVar1 + local_30;
  }
  return local_30 >> ((byte)(width_log2 << 1) & 0x3f);
}

Assistant:

static uint64_t compute_cdef_dist_highbd(void *dst, int dstride, uint16_t *src,
                                         cdef_list *dlist, int cdef_count,
                                         BLOCK_SIZE bsize, int coeff_shift,
                                         int row, int col) {
  assert(bsize == BLOCK_4X4 || bsize == BLOCK_4X8 || bsize == BLOCK_8X4 ||
         bsize == BLOCK_8X8);
  uint64_t sum = 0;
  int bi, bx, by;
  uint16_t *dst16 = CONVERT_TO_SHORTPTR((uint8_t *)dst);
  uint16_t *dst_buff = &dst16[row * dstride + col];
  int src_stride, width, height, width_log2, height_log2;
  init_src_params(&src_stride, &width, &height, &width_log2, &height_log2,
                  bsize);
  for (bi = 0; bi < cdef_count; bi++) {
    by = dlist[bi].by;
    bx = dlist[bi].bx;
    sum += aom_mse_wxh_16bit_highbd(
        &dst_buff[(by << height_log2) * dstride + (bx << width_log2)], dstride,
        &src[bi << (height_log2 + width_log2)], src_stride, width, height);
  }
  return sum >> 2 * coeff_shift;
}